

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O0

void p_crypto_hash_sha3_update(PHashSHA3 *ctx,puchar *data,psize len)

{
  uint uVar1;
  uint local_24;
  puint32 to_fill;
  puint32 left;
  psize len_local;
  puchar *data_local;
  PHashSHA3 *ctx_local;
  
  local_24 = ctx->len;
  uVar1 = ctx->block_size - local_24;
  ctx->len = (puint32)((ctx->len + len) % (ulong)ctx->block_size);
  _to_fill = len;
  len_local = (psize)data;
  if ((local_24 != 0) && (uVar1 <= len)) {
    memcpy((void *)((long)&ctx->buf + (ulong)local_24),data,(ulong)uVar1);
    pp_crypto_hash_sha3_swap_bytes((puint64 *)ctx,ctx->block_size >> 3);
    pp_crypto_hash_sha3_process(ctx,(puint64 *)ctx);
    len_local = (psize)(data + uVar1);
    _to_fill = len - uVar1;
    local_24 = 0;
  }
  for (; ctx->block_size <= _to_fill; _to_fill = _to_fill - ctx->block_size) {
    memcpy(ctx,(void *)len_local,(ulong)ctx->block_size);
    pp_crypto_hash_sha3_swap_bytes((puint64 *)ctx,ctx->block_size >> 3);
    pp_crypto_hash_sha3_process(ctx,(puint64 *)ctx);
    len_local = len_local + ctx->block_size;
  }
  if (_to_fill != 0) {
    memcpy((void *)((long)&ctx->buf + (ulong)local_24),(void *)len_local,_to_fill);
  }
  return;
}

Assistant:

void
p_crypto_hash_sha3_update (PHashSHA3	*ctx,
			   const puchar	*data,
			   psize	len)
{
	puint32	left;
	puint32 to_fill;

	left     = ctx->len;
	to_fill  = ctx->block_size - left;
	ctx->len = (puint32) (((psize) ctx->len + len) % (psize) ctx->block_size);

	if (left && (puint64) len >= to_fill) {
		memcpy (ctx->buf.buf + left, data, to_fill);
		pp_crypto_hash_sha3_swap_bytes (ctx->buf.buf_w, ctx->block_size >> 3);
		pp_crypto_hash_sha3_process (ctx, ctx->buf.buf_w);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= ctx->block_size) {
		memcpy (ctx->buf.buf, data, ctx->block_size);
		pp_crypto_hash_sha3_swap_bytes (ctx->buf.buf_w, ctx->block_size >> 3);
		pp_crypto_hash_sha3_process (ctx, ctx->buf.buf_w);

		data += ctx->block_size;
		len -= ctx->block_size;
	}

	if (len > 0)
		memcpy (ctx->buf.buf + left, data, len);
}